

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter_p.h
# Opt level: O2

void __thiscall asmjit::v1_14::CodeWriter::remove8(CodeWriter *this,uint8_t *where)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  puVar1 = this->_cursor;
  if (puVar1 <= where) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/../core/codewriter_p.h"
               ,0x85,"where < _cursor");
  }
  while (puVar2 = where + 1, puVar2 != puVar1) {
    *where = *puVar2;
    where = puVar2;
    puVar1 = this->_cursor;
  }
  this->_cursor = puVar1 + -1;
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void remove8(uint8_t* where) noexcept {
    ASMJIT_ASSERT(where < _cursor);

    uint8_t* p = where;
    while (++p != _cursor)
      p[-1] = p[0];
    _cursor--;
  }